

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wdelay_state_goto(OutputFile *this,uint32_t ind)

{
  value_type this_00;
  opt_t *poVar1;
  reference ppOVar2;
  OutputFragment *this_01;
  OutputFragment *local_20;
  uint32_t local_14;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *this_local;
  
  local_14 = ind;
  pOStack_10 = this;
  poVar1 = Opt::operator->((Opt *)&opts);
  if (((poVar1->fFlag & 1U) != 0) && ((bWroteGetState & 1) == 0)) {
    ppOVar2 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::back
                        (&this->blocks);
    this_00 = *ppOVar2;
    this_01 = (OutputFragment *)operator_new(0x188);
    OutputFragment::OutputFragment(this_01,STATE_GOTO,local_14);
    local_20 = this_01;
    std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::push_back
              (&this_00->fragments,&local_20);
    insert_code(this);
    bWroteGetState = 1;
  }
  return this;
}

Assistant:

OutputFile & OutputFile::wdelay_state_goto (uint32_t ind)
{
	if (opts->fFlag && !bWroteGetState)
	{
		blocks.back ()->fragments.push_back (new OutputFragment (OutputFragment::STATE_GOTO, ind));
		insert_code ();
		bWroteGetState = true;
	}
	return *this;
}